

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestHarness_c_cpputest_malloc_out_of_memory_TestShell::createTest
          (TEST_TestHarness_c_cpputest_malloc_out_of_memory_TestShell *this)

{
  TEST_TestHarness_c_cpputest_malloc_out_of_memory_Test *this_00;
  TEST_TestHarness_c_cpputest_malloc_out_of_memory_TestShell *this_local;
  
  this_00 = (TEST_TestHarness_c_cpputest_malloc_out_of_memory_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
                         ,0x2ce);
  TEST_TestHarness_c_cpputest_malloc_out_of_memory_Test::
  TEST_TestHarness_c_cpputest_malloc_out_of_memory_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestHarness_c, cpputest_malloc_out_of_memory)
{
    cpputest_malloc_set_out_of_memory();
    CHECK(NULLPTR == cpputest_malloc(100));

    cpputest_malloc_set_not_out_of_memory();
    void * mem = cpputest_malloc(100);
    CHECK(NULLPTR != mem);
    cpputest_free(mem);
}